

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::SmallVector<spirv_cross::HLSLVertexAttributeRemap,_8UL>::push_back
          (SmallVector<spirv_cross::HLSLVertexAttributeRemap,_8UL> *this,HLSLVertexAttributeRemap *t
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t *psVar2;
  HLSLVertexAttributeRemap *pHVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  HLSLVertexAttributeRemap *pHVar5;
  size_t sVar6;
  pointer pcVar7;
  size_type sVar8;
  
  reserve(this,(this->super_VectorView<spirv_cross::HLSLVertexAttributeRemap>).buffer_size + 1);
  pHVar5 = (this->super_VectorView<spirv_cross::HLSLVertexAttributeRemap>).ptr;
  sVar6 = (this->super_VectorView<spirv_cross::HLSLVertexAttributeRemap>).buffer_size;
  pHVar3 = pHVar5 + sVar6;
  pHVar3->location = t->location;
  paVar4 = &pHVar5[sVar6].semantic.field_2;
  (&paVar4->_M_allocated_capacity)[-2] = (size_type)paVar4;
  pcVar7 = (t->semantic)._M_dataplus._M_p;
  paVar1 = &(t->semantic).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar7 == paVar1) {
    sVar8 = *(size_type *)((long)&(t->semantic).field_2 + 8);
    paVar4->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    (&paVar4->_M_allocated_capacity)[1] = sVar8;
  }
  else {
    (pHVar3->semantic)._M_dataplus._M_p = pcVar7;
    (pHVar3->semantic).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (pHVar3->semantic)._M_string_length = (t->semantic)._M_string_length;
  (t->semantic)._M_dataplus._M_p = (pointer)paVar1;
  (t->semantic)._M_string_length = 0;
  (t->semantic).field_2._M_local_buf[0] = '\0';
  psVar2 = &(this->super_VectorView<spirv_cross::HLSLVertexAttributeRemap>).buffer_size;
  *psVar2 = *psVar2 + 1;
  return;
}

Assistant:

void push_back(T &&t) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::move(t));
		this->buffer_size++;
	}